

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O0

void copy_kss_fields(header_t *h,track_info_t *out)

{
  char *in_RSI;
  long in_RDI;
  char *system;
  char *in;
  
  in = "MSX";
  if (((*(byte *)(in_RDI + 0xf) & 2) != 0) &&
     (in = "Sega Master System", (*(byte *)(in_RDI + 0xf) & 4) != 0)) {
    in = "Game Gear";
  }
  Gme_File::copy_field_(in_RSI,in);
  return;
}

Assistant:

static void copy_kss_fields( Kss_Emu::header_t const& h, track_info_t* out )
{
	const char* system = "MSX";
	if ( h.device_flags & 0x02 )
	{
		system = "Sega Master System";
		if ( h.device_flags & 0x04 )
			system = "Game Gear";
	}
	Gme_File::copy_field_( out->system, system );
}